

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

optional<pbrt::LightBounds> * __thiscall
pbrt::SpotLight::Bounds(optional<pbrt::LightBounds> *__return_storage_ptr__,SpotLight *this)

{
  Transform *this_00;
  float fVar1;
  Float FVar2;
  undefined8 uVar3;
  Float FVar4;
  float fVar5;
  float fVar6;
  undefined1 in_ZMM0 [64];
  undefined1 auVar11 [56];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  Point3<float> PVar12;
  Vector3<float> VVar13;
  undefined1 local_78 [32];
  Tuple3<pbrt::Vector3,_float> local_58;
  Tuple3<pbrt::Point3,_float> local_48;
  Bounds3<float> local_38;
  
  auVar11 = in_ZMM0._8_56_;
  this_00 = &(this->super_LightBase).renderFromLight;
  local_78._0_4_ = 0.0;
  local_78._4_4_ = 0.0;
  local_78._8_8_ = local_78._8_8_ & 0xffffffff00000000;
  PVar12 = Transform::operator()(this_00,(Point3<float> *)local_78);
  local_48.z = PVar12.super_Tuple3<pbrt::Point3,_float>.z;
  auVar7._0_8_ = PVar12.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar7._8_56_ = auVar11;
  local_48._0_8_ = vmovlps_avx(auVar7._0_16_);
  local_38.pMin.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  local_38.pMin.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  local_38.pMin.super_Tuple3<pbrt::Point3,_float>.z = 1.0;
  VVar13 = Transform::operator()(this_00,(Vector3<float> *)&local_38);
  auVar8._0_8_ = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar8._8_56_ = auVar11;
  local_78._0_8_ = vmovlps_avx(auVar8._0_16_);
  local_78._8_4_ = VVar13.super_Tuple3<pbrt::Vector3,_float>.z;
  VVar13 = Normalize<float>((Vector3<float> *)local_78);
  local_58.z = VVar13.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar9._0_8_ = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar9._8_56_ = auVar11;
  local_58._0_8_ = vmovlps_avx(auVar9._0_16_);
  fVar1 = this->scale;
  FVar4 = DenselySampledSpectrum::MaxValue(&this->Iemit);
  fVar5 = acosf(this->cosFalloffEnd);
  fVar6 = acosf(this->cosFalloffStart);
  fVar5 = cosf(fVar5 - fVar6);
  if ((fVar5 == 1.0) && (!NAN(fVar5))) {
    if ((this->cosFalloffEnd != this->cosFalloffStart) ||
       (NAN(this->cosFalloffEnd) || NAN(this->cosFalloffStart))) {
      fVar5 = 0.999;
    }
    else {
      fVar5 = 1.0;
    }
  }
  Bounds3<float>::Bounds3(&local_38,(Point3<float> *)&local_48,(Point3<float> *)&local_48);
  FVar2 = this->cosFalloffStart;
  local_78._16_4_ = local_38.pMax.super_Tuple3<pbrt::Point3,_float>.y;
  local_78._20_4_ = local_38.pMax.super_Tuple3<pbrt::Point3,_float>.z;
  local_78._8_8_ =
       CONCAT44(local_38.pMax.super_Tuple3<pbrt::Point3,_float>.x,
                local_38.pMin.super_Tuple3<pbrt::Point3,_float>.z);
  auVar11 = ZEXT856((ulong)local_78._8_8_);
  local_78._0_4_ = local_38.pMin.super_Tuple3<pbrt::Point3,_float>.x;
  local_78._4_4_ = local_38.pMin.super_Tuple3<pbrt::Point3,_float>.y;
  VVar13 = Normalize<float>((Vector3<float> *)&local_58);
  auVar10._0_8_ = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar10._8_56_ = auVar11;
  __return_storage_ptr__->set = true;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = local_78._16_8_;
  *(undefined8 *)&__return_storage_ptr__->optionalValue = local_78._0_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = local_78._8_8_;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) = FVar4 * fVar1 * 4.0 * 3.1415927;
  uVar3 = vmovlps_avx(auVar10._0_16_);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = uVar3;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x24) =
       VVar13.super_Tuple3<pbrt::Vector3,_float>.z;
  *(Float *)((long)&__return_storage_ptr__->optionalValue + 0x28) = FVar2;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x2c) = fVar5;
  (__return_storage_ptr__->optionalValue).__data[0x30] = '\0';
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightBounds> SpotLight::Bounds() const {
    Point3f p = renderFromLight(Point3f(0, 0, 0));
    Vector3f w = Normalize(renderFromLight(Vector3f(0, 0, 1)));
    Float phi = scale * Iemit.MaxValue() * 4 * Pi;
    Float cosTheta_e = std::cos(std::acos(cosFalloffEnd) - std::acos(cosFalloffStart));
    // Allow a little slop here to deal with fp round-off error in the computation of
    // cosTheta_p in the importance function.
    if (cosTheta_e == 1 && cosFalloffEnd != cosFalloffStart)
        cosTheta_e = 0.999f;
    return LightBounds(Bounds3f(p, p), w, phi, cosFalloffStart, cosTheta_e, false);
}